

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

void xercesc_4_0::XMLInitializer::terminateXMLScanner(void)

{
  XMLMutex *this;
  void *in_RSI;
  
  if (gMsgLoader != (long *)0x0) {
    (**(code **)(*gMsgLoader + 8))();
  }
  this = sScannerMutex;
  gMsgLoader = (long *)0x0;
  if (sScannerMutex != (XMLMutex *)0x0) {
    XMLMutex::~XMLMutex(sScannerMutex);
    XMemory::operator_delete((XMemory *)this,in_RSI);
  }
  sScannerMutex = (XMLMutex *)0x0;
  return;
}

Assistant:

void XMLInitializer::terminateXMLScanner()
{
    delete gMsgLoader;
    gMsgLoader = 0;

    delete sScannerMutex;
    sScannerMutex = 0;
}